

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall
crnd::crn_unpacker::unpack_dxt5a
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  uint uVar1;
  block_buffer_element *pbVar2;
  unsigned_short *puVar3;
  bool bVar4;
  byte bVar5;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint8 *puVar13;
  uint min_new_capacity;
  uint local_b0;
  uint local_ac;
  uint8 *local_a0;
  byte bVar6;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  uVar11 = (this->m_block_buffer).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  if (uVar11 < min_new_capacity) {
    if ((min_new_capacity <= (this->m_block_buffer).m_capacity) ||
       (bVar4 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_block_buffer,min_new_capacity,
                           uVar11 + 1 == min_new_capacity,8,(object_mover)0x0), bVar4)) {
      (this->m_block_buffer).m_size = min_new_capacity;
    }
    else {
      (this->m_block_buffer).m_alloc_failed = true;
    }
  }
  if ((this->m_pHeader->m_faces).m_buf[0] != '\0') {
    uVar8 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    uVar10 = 0;
    uVar11 = 0;
    local_ac = 0;
    do {
      if (uVar8 != 0) {
        local_a0 = pDst[uVar10];
        local_b0 = 0;
        do {
          puVar13 = local_a0;
          if (min_new_capacity != 0) {
            bVar4 = local_b0 < output_height;
            uVar12 = 0;
            do {
              if (((local_b0 | (uint)uVar12) & 1) == 0) {
                local_ac = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
              }
              pbVar2 = (this->m_block_buffer).m_p;
              if ((local_b0 & 1) == 0) {
                bVar6 = (byte)local_ac;
                bVar5 = bVar6 & 3;
                pbVar2[uVar12].endpoint_reference = (ushort)(bVar6 >> 2 & 3);
                local_ac = (uint)(bVar6 >> 4);
              }
              else {
                bVar5 = (byte)pbVar2[uVar12].endpoint_reference;
              }
              if (bVar5 == 1) {
                pbVar2[uVar12].alpha0_endpoint_index = (uint16)uVar11;
              }
              else if (bVar5 == 0) {
                uVar7 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar9 = 0;
                if (uVar1 <= uVar7 + uVar11) {
                  uVar9 = uVar1;
                }
                uVar11 = (uVar7 + uVar11) - uVar9;
                pbVar2[uVar12].alpha0_endpoint_index = (uint16)uVar11;
              }
              else {
                uVar11 = (uint)pbVar2[uVar12].alpha0_endpoint_index;
              }
              bVar4 = (bool)(bVar4 & uVar12 < output_width);
              uVar7 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              if (bVar4) {
                puVar3 = (this->m_alpha_selectors).m_p;
                *(uint *)(local_a0 + uVar12 * 8) =
                     CONCAT22(puVar3[uVar7 * 3],(this->m_alpha_endpoints).m_p[uVar11]);
                *(undefined4 *)(local_a0 + uVar12 * 8 + 4) =
                     *(undefined4 *)(puVar3 + (ulong)(uVar7 * 3) + 1);
              }
              uVar12 = uVar12 + 1;
              puVar13 = puVar13 + 8;
            } while (min_new_capacity != uVar12);
          }
          local_b0 = local_b0 + 1;
          local_a0 = puVar13 + (long)(int)((row_pitch_in_bytes >> 2) + min_new_capacity * -2) * 4;
        } while (local_b0 != uVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (this->m_pHeader->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxt5a(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 1);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 alpha0_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 2)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else
                        {
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                        }
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                        }
                    }
                }
            }
            return true;
        }